

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

char * str_find(char *haystack,char *needle)

{
  bool bVar1;
  char *b;
  char *a;
  char *needle_local;
  char *haystack_local;
  
  haystack_local = haystack;
  while( true ) {
    if (*haystack_local == '\0') {
      return (char *)0x0;
    }
    a = haystack_local;
    b = needle;
    while( true ) {
      bVar1 = false;
      if ((*a != '\0') && (bVar1 = false, *b != '\0')) {
        bVar1 = *a == *b;
      }
      if (!bVar1) break;
      a = a + 1;
      b = b + 1;
    }
    if (*b == '\0') break;
    haystack_local = haystack_local + 1;
  }
  return haystack_local;
}

Assistant:

const char *str_find(const char *haystack, const char *needle)
{
	while(*haystack) /* native implementation */
	{
		const char *a = haystack;
		const char *b = needle;
		while(*a && *b && *a == *b)
		{
			a++;
			b++;
		}
		if(!(*b))
			return haystack;
		haystack++;
	}

	return 0;
}